

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O1

int __thiscall
glcts::GeometryShaderRenderingPointsCase::verify
          (GeometryShaderRenderingPointsCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,
          uchar *tbs,size_t tbslen)

{
  ostringstream *poVar1;
  byte bVar2;
  uint uVar3;
  _func_int **pp_Var4;
  uchar *puVar5;
  TestError *this_00;
  int iVar6;
  long lVar7;
  byte *pbVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  int iVar16;
  byte bVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  uint rt_width;
  uint rt_height;
  int local_1ec;
  size_t local_1e8;
  ulong local_1e0;
  int local_1d4;
  int local_1d0;
  undefined4 local_1cc;
  GeometryShaderRenderingPointsCase *local_1c8;
  uchar *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1cc = 0;
  local_1ec = 0;
  uVar12 = (uint)ctx;
  pp_Var4 = (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
            super_TestNode._vptr_TestNode;
  uVar13 = 1;
  local_1e8 = siglen;
  if ((uVar12 & 0xfffffffd) == 1) {
    uVar3 = (*pp_Var4[5])(this);
    uVar13 = (ulong)uVar3;
    pp_Var4 = (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
              super_TestNode._vptr_TestNode;
  }
  (*pp_Var4[0xd])(this,uVar13,&local_1ec,&local_1cc);
  iVar6 = *(int *)&(this->super_GeometryShaderRenderingCase).field_0x304;
  iVar16 = (int)sig;
  if (iVar6 == 0) {
    iVar16 = iVar16 * 5 + 1;
    uVar3 = local_1ec * iVar16;
    puVar5 = (uchar *)(ulong)uVar3;
    pbVar8 = this->m_unordered_elements_data;
    iVar6 = 1;
    lVar7 = 0;
    do {
      if (uVar12 - 2 < 3) {
        bVar2 = *pbVar8;
        iVar22 = uVar3 + (uint)bVar2 + (uint)bVar2 * 4 + 1;
        lVar14 = (ulong)bVar2 * -4 + 0x1c;
        iVar9 = (uint)bVar2 + (uint)bVar2 * 4 + 1;
      }
      else {
        iVar22 = uVar3 + iVar6;
        lVar14 = lVar7;
        iVar9 = iVar6;
      }
      uVar13 = (ulong)(uint)(iVar22 << 2);
      if (*(int *)(local_1e8 + uVar13) != *(int *)(verify::ref_data + lVar14)) {
        local_1b0._0_8_ =
             ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Reference data: [",0x11);
        std::ostream::operator<<(poVar1,(uint)verify::ref_data[lVar14]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(uint)verify::ref_data[lVar14 + 1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(uint)verify::ref_data[lVar14 + 2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(uint)verify::ref_data[lVar14 + 3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"] for pixel at (",0x10);
        std::ostream::operator<<(poVar1,iVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,") does not match  [",0x13);
        std::ostream::operator<<(poVar1,(uint)*(byte *)(local_1e8 + uVar13));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(uint)*(byte *)(local_1e8 + 1 + uVar13));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(uint)*(byte *)(local_1e8 + 2 + uVar13));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(uint)*(byte *)(local_1e8 + 3 + uVar13));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,").",2);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Data comparison failed.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0x748);
        goto LAB_00d2095e;
      }
      iVar6 = iVar6 + 5;
      lVar7 = lVar7 + 4;
      pbVar8 = pbVar8 + 1;
    } while (lVar7 != 0x20);
  }
  else if (iVar6 == 1) {
    local_1c0 = this->m_unordered_elements_data;
    local_1d4 = iVar16 * 7;
    local_1d0 = local_1ec * 4;
    local_1b8 = 0;
    do {
      local_1e0 = local_1b8 * 4;
      uVar13 = 0;
      do {
        local_1c8 = this;
        if (3 < (uint)uVar13) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Invalid edge index",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0x6e6);
          goto LAB_00d2095e;
        }
        uVar3 = (uint)local_1b8;
        uVar21 = local_1e0;
        if (1 < uVar12) {
          uVar3 = (uint)local_1c0[local_1b8];
          uVar21 = 0x1c - (ulong)((uint)local_1c0[local_1b8] * 4);
        }
        iVar22 = (&DAT_01b8c900)[uVar13] + local_1d4;
        iVar9 = uVar3 * 7 + (&DAT_01b8c8f0)[uVar13];
        iVar6 = uVar3 * 0x1c + (&DAT_01b8c8f0)[uVar13] * 4;
        puVar5 = (uchar *)(ulong)(uint)(local_1d0 * iVar22);
        iVar16 = 5;
        do {
          lVar7 = (long)(int)puVar5 + local_1e8;
          lVar14 = (long)iVar6;
          if (*(int *)(lVar14 + lVar7) != *(int *)(verify::ref_data + uVar21)) {
            local_1b0._0_8_ =
                 ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                  super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"At            (",0xf);
            std::ostream::operator<<(poVar1,iVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::operator<<(poVar1,iVar22);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"), rendered data (",0x12);
            std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar7 + lVar14));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar7 + 1 + lVar14));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar7 + 2 + lVar14));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar7 + 3 + lVar14));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,") is different from reference data (",0x24);
            std::ostream::operator<<(poVar1,(uint)verify::ref_data[uVar21]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::operator<<(poVar1,(uint)verify::ref_data[uVar21 + 1]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::operator<<(poVar1,(uint)verify::ref_data[uVar21 + 2]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::operator<<(poVar1,(uint)verify::ref_data[uVar21 + 3]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Data comparison failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                       ,0x70d);
            goto LAB_00d2095e;
          }
          iVar22 = iVar22 + (&DAT_01b8c8e0)[uVar13];
          iVar9 = iVar9 + (int)(&DAT_01b98270)[uVar13];
          iVar6 = iVar6 + (int)(&DAT_01b98270)[uVar13] * 4;
          puVar5 = (uchar *)(ulong)(uint)((int)puVar5 + local_1d0 * (&DAT_01b8c8e0)[uVar13]);
          iVar16 = iVar16 + -1;
        } while (iVar16 != 0);
        uVar3 = (uint)uVar13 + 1;
        uVar13 = (ulong)uVar3;
      } while (uVar3 != 4);
      local_1b8 = local_1b8 + 1;
    } while (local_1b8 != 8);
  }
  else {
    if (iVar6 != 2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unsupported output layout qualifier requested.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x7b5);
LAB_00d2095e:
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    iVar6 = iVar16 * 6 + 6;
    iVar9 = iVar6 + iVar16 * 6;
    iVar6 = (iVar6 + iVar9) / 3;
    uVar3 = (iVar9 + iVar16 * 6) / 3;
    local_1e0 = (ulong)uVar3;
    lVar20 = (uint)(local_1ec * 4 * iVar6) + local_1e8;
    puVar5 = this->m_unordered_elements_data;
    lVar19 = local_1ec * 4 * uVar3 + local_1e8;
    lVar7 = 0;
    lVar14 = 0;
    do {
      if (uVar12 - 2 < 3) {
        uVar3 = (uint)puVar5[lVar14];
        lVar18 = 0x1c - (ulong)((uint)puVar5[lVar14] * 4);
      }
      else {
        uVar3 = (uint)lVar14;
        lVar18 = lVar7;
      }
      uVar10 = uVar3 * 0x12 + 6;
      uVar13 = (ulong)uVar10 / 3;
      bVar2 = verify::ref_data_triangle_strip[lVar18];
      iVar16 = (uint)*(byte *)(lVar20 + uVar13 * 4) - (uint)bVar2;
      bVar15 = (byte)iVar16;
      bVar17 = -bVar15;
      if (0 < iVar16) {
        bVar17 = bVar15;
      }
      if ((((1 < bVar17) || (*(char *)(lVar20 + 1 + uVar13 * 4) != '\0')) ||
          (*(char *)(lVar20 + 2 + uVar13 * 4) != '\0')) ||
         (*(char *)(lVar20 + 3 + uVar13 * 4) != '\0')) {
        local_1b0._0_8_ =
             ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"At (",4);
        std::ostream::operator<<(poVar1,uVar10 / 3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"rendered pixel (",0x10);
        std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar20 + uVar13 * 4));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar20 + 1 + uVar13 * 4));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar20 + 2 + uVar13 * 4));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar20 + 3 + uVar13 * 4));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"is different than (",0x13);
        std::ostream::operator<<(poVar1,(uint)bVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", 0, 0, 0).",0xb);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Data comparison failed.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0x79a);
        goto LAB_00d2095e;
      }
      uVar3 = uVar3 * 0x12 + 0xc;
      lVar11 = (long)(int)((uVar3 / 3) * 4);
      if (*(char *)(lVar19 + lVar11) != '\0') {
LAB_00d20b0d:
        local_1b0._0_8_ =
             ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"At (",4);
        std::ostream::operator<<(poVar1,uVar3 / 3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(int)local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"rendered pixel (",0x10);
        std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar19 + lVar11));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar19 + 1 + lVar11));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar19 + 2 + lVar11));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(uint)*(byte *)(lVar19 + 3 + lVar11));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"is different than (0, ",0x16);
        std::ostream::operator<<(poVar1,(uint)verify::ref_data_triangle_strip[lVar18 + 1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", 0, 0).",8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Data comparison failed.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0x7ac);
        goto LAB_00d2095e;
      }
      iVar16 = (uint)*(byte *)(lVar19 + 1 + lVar11) -
               (uint)verify::ref_data_triangle_strip[lVar18 + 1];
      bVar2 = (byte)iVar16;
      bVar15 = -bVar2;
      if (0 < iVar16) {
        bVar15 = bVar2;
      }
      if (((1 < bVar15) || (*(char *)(lVar19 + 2 + lVar11) != '\0')) ||
         (*(char *)(lVar19 + 3 + lVar11) != '\0')) goto LAB_00d20b0d;
      lVar14 = lVar14 + 1;
      lVar7 = lVar7 + 4;
    } while (lVar14 != 8);
  }
  return (int)puVar5;
}

Assistant:

void GeometryShaderRenderingPointsCase::verify(_draw_call_type drawcall_type, unsigned int instance_id,
											   const unsigned char* data)
{
	/* The array is directly related to vertex shader contents for "points" and "line_strip"
	 * outputs */
	static const unsigned char ref_data[] = { 255, 0, 0, 0,   0,   255, 0,   0, 0,   0,   255, 0,
											  0,   0, 0, 255, 255, 255, 0,   0, 255, 0,   255, 0,
											  255, 0, 0, 255, 255, 255, 255, 0, 255, 255, 0,   255 };
	/* The array refers to colors as defined in vertex shader used for "triangle_strip"
	 * output.
	 */
	static const unsigned char ref_data_triangle_strip[] = {
		(unsigned char)(0.1f * 255), (unsigned char)(0.8f * 255), 0,   0,
		(unsigned char)(0.2f * 255), (unsigned char)(0.7f * 255), 0,   0,
		(unsigned char)(0.3f * 255), (unsigned char)(0.6f * 255), 255, 0,
		(unsigned char)(0.4f * 255), (unsigned char)(0.5f * 255), 0,   255,
		(unsigned char)(0.5f * 255), (unsigned char)(0.4f * 255), 0,   0,
		(unsigned char)(0.6f * 255), (unsigned char)(0.3f * 255), 255, 0,
		(unsigned char)(0.7f * 255), (unsigned char)(0.2f * 255), 0,   255,
		(unsigned char)(0.8f * 255), (unsigned char)(0.1f * 255), 255, 0
	};
	unsigned int rt_height = 0;
	unsigned int rt_width  = 0;

	/* Retrieve render-target size */
	if (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED ||
		drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED)
	{
		getRenderTargetSize(getAmountOfDrawInstances(), &rt_width, &rt_height);
	}
	else
	{
		getRenderTargetSize(1, &rt_width, &rt_height);
	}

	switch (m_output_type)
	{
	case SHADER_OUTPUT_TYPE_LINE_STRIP:
	{
		for (unsigned int n_point = 0; n_point < 8 /* points */; ++n_point)
		{
			/* Each point takes a 7x7 block. The test should verify that the second "nested" block
			 * is of the valid color. Blocks can be built on top of each other if instanced draw
			 * calls are used. */
			const unsigned char* reference_data		   = NULL;
			const unsigned char* rendered_data		   = NULL;
			const int			 row_width			   = rt_width * 4 /* components */;
			const int			 sample_region_edge_px = 5 /* pixels */;

			for (int n_edge = 0; n_edge < 4 /* edges */; ++n_edge)
			{
				/* Edge 1: TL->TR
				 * Edge 2: TR->BR
				 * Edge 3: BR->BL
				 * Edge 4: BL->TL
				 */
				int dx		= 0;
				int dy		= 0;
				int x		= 0;
				int x_start = 0;
				int y		= 0;
				int y_start = 0;

				switch (n_edge)
				{
				/* NOTE: The numbers here are as per test spec */
				case 0:
					dx		= 1 /* px */;
					dy		= 0 /* px */;
					x_start = 1 /* px */;
					y_start = 1 /* px */;
					break;
				case 1:
					dx		= 0 /* px */;
					dy		= 1 /* px */;
					x_start = 5 /* px */;
					y_start = 1 /* px */;
					break;
				case 2:
					dx		= -1 /* px */;
					dy		= 0 /* px */;
					x_start = 5 /* px */;
					y_start = 5 /* px */;
					break;
				case 3:
					dx		= 0 /* px */;
					dy		= -1 /* px */;
					x_start = 1 /* px */;
					y_start = 5 /* px */;
					break;

				default:
				{
					TCU_FAIL("Invalid edge index");
				}
				} /* switch (n_edge) */

				/* What color should the pixels have? */
				if (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS ||
					drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED)
				{
					reference_data = ref_data + n_point * 4 /* components */;
					x			   = x_start + n_point * 7 /* pixel block size */;
					y			   = y_start + instance_id * 7 /* pixel block size */;
				}
				else
				{
					int index = m_unordered_elements_data[n_point];

					reference_data = ref_data + (8 - 1 - index) * 4 /* components */;
					x			   = x_start + index * 7 /* pixel block size */;
					y			   = y_start + instance_id * 7 /* pixel block size */;
				}

				/* Verify edge pixels */
				for (int n_pixel = 0; n_pixel < sample_region_edge_px; ++n_pixel)
				{
					rendered_data = data + y * row_width + x * 4 /* components */;

					if (memcmp(rendered_data, reference_data, 4 /* components */) != 0)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "At            (" << (int)x << ", " << (int)y
										   << "), "
											  "rendered data ("
										   << (int)rendered_data[0] << ", " << (int)rendered_data[1] << ", "
										   << (int)rendered_data[2] << ", " << (int)rendered_data[3]
										   << ") "
											  "is different from reference data ("
										   << (int)reference_data[0] << ", " << (int)reference_data[1] << ", "
										   << (int)reference_data[2] << ", " << (int)reference_data[3] << ")"
										   << tcu::TestLog::EndMessage;

						TCU_FAIL("Data comparison failed");
					} /* if (data comparison failed) */

					/* Move to next pixel */
					x += dx;
					y += dy;
				} /* for (all pixels) */
			}	 /* for (all edges) */
		}		  /* for (all points) */

		break;
	} /* case SHADER_OUTPUT_TYPE_LINE_STRIP: */

	case SHADER_OUTPUT_TYPE_POINTS:
	{
		/* For each 3px high row, we want to sample the second row. Area of a single "pixel" (incl. delta)
		 * can take no more than 5px, with the actual sampled area located in the second pixel.
		 */
		const int sample_region_width_px = 5; /* pixels */

		for (int n = 0; n < 8 /* points */; ++n)
		{
			int					 x				= 0;
			int					 y				= 0;
			const unsigned char* reference_data = NULL;
			const unsigned char* rendered_data  = NULL;

			/* Different ordering is used for indexed draw calls */
			if (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS ||
				drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED ||
				drawcall_type == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS)
			{
				/* For indexed calls, vertex data is laid out in a reversed ordered */
				int index = m_unordered_elements_data[n];

				x			   = index * sample_region_width_px + 1;
				y			   = instance_id * 5 + 1; /* middle row */
				reference_data = ref_data + ((8 - 1 - index) * 4 /* components */);
				rendered_data  = data + (y * rt_width + x) * 4 /* components */;
			} /* if (draw call is indiced) */
			else
			{
				x			   = n * sample_region_width_px + 1;
				y			   = instance_id * 5 + 1; /* middle row */
				reference_data = ref_data + (n * 4 /* components */);
				rendered_data  = data + (y * rt_width + x) * 4 /* components */;
			}

			if (memcmp(rendered_data, reference_data, 4 /* components */) != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Reference data: [" << (int)reference_data[0] << ", "
								   << (int)reference_data[1] << ", " << (int)reference_data[2] << ", "
								   << (int)reference_data[3] << "] "
																"for pixel at ("
								   << x << ", " << y << ") "
														"does not match  ["
								   << (int)rendered_data[0] << ", " << (int)rendered_data[1] << ", "
								   << (int)rendered_data[2] << ", " << (int)rendered_data[3] << ").";

				TCU_FAIL("Data comparison failed.");
			} /* if (memcmp(rendered_data, reference_data, 4) != 0) */
		}	 /* for (all points) */

		break;
	} /* case SHADER_OUTPUT_TYPE_POINTS: */

	case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
	{
		/* A pair of adjacent triangles is contained within a 6x6 bounding box.
		 * The box is defined by top-left corner which is located at input point's
		 * location.
		 * The left triangle should only use red channel, the one on the right
		 * should only use green channel.
		 * We find centroid for each triangle, sample its color and make sure
		 * it's valid.
		 */
		for (int n_point = 0; n_point < 8 /* points */; ++n_point)
		{
			const unsigned int   epsilon					   = 1;
			int					 point_x					   = 0;
			int					 point_y					   = 6 * instance_id;
			const unsigned char* rendered_data				   = NULL;
			const unsigned char* reference_data				   = 0;
			const unsigned int   row_width					   = rt_width * 4 /* components */;
			int					 t1[6 /* 3 * {x, y} */]		   = { 0 };
			int					 t2[6 /* 3 * {x, y} */]		   = { 0 };
			int					 t1_center[2 /*     {x, y} */] = { 0 };
			int					 t2_center[2 /*     {x, y} */] = { 0 };

			/* Different ordering is used for indexed draw calls */
			if (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS ||
				drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED ||
				drawcall_type == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS)
			{
				int index = m_unordered_elements_data[n_point];

				point_x		   = 6 * index;
				reference_data = ref_data_triangle_strip + (8 - 1 - index) * 4 /* components */;
			}
			else
			{
				point_x		   = 6 * n_point;
				reference_data = ref_data_triangle_strip + n_point * 4 /* components */;
			}

			/* Calculate triangle vertex locations (corresponds to geometry shader logic) */
			t1[0] = point_x;
			t1[1] = point_y + 6;
			t1[2] = point_x;
			t1[3] = point_y;
			t1[4] = point_x + 6;
			t1[5] = point_y + 6;

			t2[0] = point_x + 6;
			t2[1] = point_y + 6;
			t2[2] = point_x;
			t2[3] = point_y;
			t2[4] = point_x + 6;
			t2[5] = point_y;

			/* Calculate centroid locations */
			t1_center[0] = (t1[0] + t1[2] + t1[4]) / 3;
			t2_center[0] = (t2[0] + t2[2] + t2[4]) / 3;
			t1_center[1] = (t1[1] + t1[3] + t1[5]) / 3;
			t2_center[1] = (t2[1] + t2[3] + t2[5]) / 3;

			/* Check the first triangle */
			point_x = t1_center[0];
			point_y = t1_center[1];

			rendered_data = data + point_y * row_width + point_x * 4 /* components */;

			if ((unsigned int)de::abs((int)rendered_data[0] - reference_data[0]) > epsilon || rendered_data[1] != 0 ||
				rendered_data[2] != 0 || rendered_data[3] != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "At (" << (int)point_x << ", " << (int)point_y << ") "
								   << "rendered pixel (" << (int)rendered_data[0] << ", " << (int)rendered_data[1]
								   << ", " << (int)rendered_data[2] << ", " << (int)rendered_data[3] << ") "
								   << "is different than (" << (int)reference_data[0] << ", 0, 0, 0)."
								   << tcu::TestLog::EndMessage;

				TCU_FAIL("Data comparison failed.");
			}

			/* Check the other triangle */
			point_x = t2_center[0];
			point_y = t2_center[1];

			rendered_data = data + point_y * row_width + point_x * 4 /* components */;

			if (rendered_data[0] != 0 || (unsigned int)de::abs((int)rendered_data[1] - reference_data[1]) > epsilon ||
				rendered_data[2] != 0 || rendered_data[3] != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "At (" << (int)point_x << ", " << (int)point_y << ") "
								   << "rendered pixel (" << (int)rendered_data[0] << ", " << (int)rendered_data[1]
								   << ", " << (int)rendered_data[2] << ", " << (int)rendered_data[3] << ") "
								   << "is different than (0, " << (int)reference_data[1] << ", 0, 0)."
								   << tcu::TestLog::EndMessage;

				TCU_FAIL("Data comparison failed.");
			}
		} /* for (all points) */

		break;
	} /* case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:*/

	default:
	{
		TCU_FAIL("Unsupported output layout qualifier requested.");

		break;
	}
	} /* switch(m_output_type) */
}